

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ImageFeatureType::InternalSwap
          (ImageFeatureType *this,ImageFeatureType *other)

{
  ImageFeatureType *other_local;
  ImageFeatureType *this_local;
  
  std::swap<long>(&this->width_,&other->width_);
  std::swap<long>(&this->height_,&other->height_);
  std::swap<int>(&this->colorspace_,&other->colorspace_);
  std::swap<CoreML::Specification::ImageFeatureType::SizeFlexibilityUnion>
            (&this->SizeFlexibility_,&other->SizeFlexibility_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void ImageFeatureType::InternalSwap(ImageFeatureType* other) {
  std::swap(width_, other->width_);
  std::swap(height_, other->height_);
  std::swap(colorspace_, other->colorspace_);
  std::swap(SizeFlexibility_, other->SizeFlexibility_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(_cached_size_, other->_cached_size_);
}